

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.h
# Opt level: O0

void __thiscall Network::add_link(Network *this,uint node_i,uint node_j)

{
  reference pvVar1;
  size_type sVar2;
  uint local_18;
  uint local_14;
  uint node_j_local;
  uint node_i_local;
  Network *this_local;
  
  local_18 = node_j;
  local_14 = node_i;
  _node_j_local = this;
  pvVar1 = std::
           vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
           ::operator[](&this->links,(ulong)node_i);
  sVar2 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::count
                    (pvVar1,&local_18);
  if (sVar2 == 0) {
    update_triangles(this,local_14,local_18,true);
    pvVar1 = std::
             vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             ::operator[](&this->links,(ulong)local_14);
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
              (pvVar1,&local_18);
    pvVar1 = std::
             vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             ::operator[](&this->links,(ulong)local_18);
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
              (pvVar1,&local_14);
    return;
  }
  __assert_fail("links[node_i].count(node_j) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SamplingConstrainedNetworks[P]code/source/network.h"
                ,0xb0,"void Network::add_link(unsigned int, unsigned int)");
}

Assistant:

void add_link(unsigned int node_i, unsigned int node_j) {
        assert(links[node_i].count(node_j) == 0);  // link must not exist

        update_triangles(node_i, node_j, true);

        links[node_i].insert(node_j);
        links[node_j].insert(node_i);
    }